

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

uint64_t __thiscall
kj::anon_unknown_123::AsyncTee::Buffer::consume
          (Buffer *this,ArrayPtr<unsigned_char> *readBuffer,size_t *minBytes)

{
  _Elt_pointer pAVar1;
  uchar *puVar2;
  uchar *__dest;
  size_t sVar3;
  uint64_t uVar4;
  size_t sVar5;
  size_t capacity;
  Array<unsigned_char> result;
  
  sVar5 = readBuffer->size_;
  if (sVar5 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    do {
      pAVar1 = (this->bufferList).
               super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((this->bufferList).
          super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur == pAVar1) {
        return uVar4;
      }
      if (pAVar1->size_ < sVar5) {
        sVar5 = pAVar1->size_;
      }
      memcpy(readBuffer->ptr,pAVar1->ptr,sVar5);
      uVar4 = uVar4 + sVar5;
      readBuffer->ptr = readBuffer->ptr + sVar5;
      readBuffer->size_ = readBuffer->size_ - sVar5;
      sVar3 = 0;
      if (sVar5 <= *minBytes) {
        sVar3 = *minBytes - sVar5;
      }
      *minBytes = sVar3;
      capacity = pAVar1->size_ - sVar5;
      if (capacity != 0) {
        puVar2 = pAVar1->ptr;
        __dest = (uchar *)kj::_::HeapArrayDisposer::allocateImpl
                                    (1,0,capacity,(_func_void_void_ptr *)0x0,
                                     (_func_void_void_ptr *)0x0);
        memcpy(__dest,puVar2 + sVar5,capacity);
        puVar2 = pAVar1->ptr;
        if (puVar2 != (uchar *)0x0) {
          sVar5 = pAVar1->size_;
          pAVar1->ptr = (uchar *)0x0;
          pAVar1->size_ = 0;
          (**pAVar1->disposer->_vptr_ArrayDisposer)(pAVar1->disposer,puVar2,1,sVar5,sVar5,0);
        }
        pAVar1->ptr = __dest;
        pAVar1->size_ = capacity;
        pAVar1->disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
        return uVar4;
      }
      std::deque<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>::pop_front
                (&this->bufferList);
      sVar5 = readBuffer->size_;
    } while (sVar5 != 0);
  }
  return uVar4;
}

Assistant:

uint64_t AsyncTee::Buffer::consume(ArrayPtr<byte>& readBuffer, size_t& minBytes) {
  uint64_t totalAmount = 0;

  while (readBuffer.size() > 0 && !bufferList.empty()) {
    auto& bytes = bufferList.front();
    auto amount = kj::min(bytes.size(), readBuffer.size());
    memcpy(readBuffer.begin(), bytes.begin(), amount);
    totalAmount += amount;

    readBuffer = readBuffer.slice(amount, readBuffer.size());
    minBytes -= kj::min(amount, minBytes);

    if (amount == bytes.size()) {
      bufferList.pop_front();
    } else {
      bytes = heapArray(bytes.slice(amount, bytes.size()));
      return totalAmount;
    }
  }

  return totalAmount;
}